

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PDFDocumentHandler.cpp
# Opt level: O2

EStatusCode __thiscall
PDFDocumentHandler::MergePDFPagesToPageInContext
          (PDFDocumentHandler *this,PDFPage *inPage,PDFPageRange *inPageRange,
          ObjectIDTypeList *inCopyAdditionalObjects)

{
  _Rb_tree_header *p_Var1;
  undefined8 uVar2;
  EStatusCode EVar3;
  Trace *pTVar4;
  _Base_ptr p_Var5;
  _List_node_base *p_Var6;
  unsigned_long uVar7;
  unsigned_long i;
  _List_node_base *p_Var8;
  ulong inSourcePageIndex;
  _List_node_base *p_Var9;
  
  p_Var5 = (this->mExtenders)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var1 = &(this->mExtenders)._M_t._M_impl.super__Rb_tree_header;
  EVar3 = eSuccess;
  while (((_Rb_tree_header *)p_Var5 != p_Var1 && (EVar3 == eSuccess))) {
    EVar3 = (**(code **)(**(long **)(p_Var5 + 1) + 0x48))
                      (*(long **)(p_Var5 + 1),this->mObjectsContext,this->mDocumentContext,this);
    if (EVar3 != eSuccess) {
      pTVar4 = Trace::DefaultTrace();
      Trace::TraceToLog(pTVar4,
                        "DocumentContext::MergePDFPagesToPage, unexpected failure. extender declared failure after parsing page."
                       );
    }
    p_Var5 = (_Base_ptr)std::_Rb_tree_increment(p_Var5);
  }
  if ((inCopyAdditionalObjects->super__List_base<unsigned_long,_std::allocator<unsigned_long>_>).
      _M_impl._M_node._M_size != 0) {
    EVar3 = WriteNewObjects(this,inCopyAdditionalObjects);
    if (EVar3 != eSuccess) {
      pTVar4 = Trace::DefaultTrace();
      Trace::TraceToLog(pTVar4,
                        "PDFDocumentHandler::MergePDFPagesToPage, failed copying additional objects"
                       );
      goto LAB_0019aa69;
    }
    EVar3 = eSuccess;
  }
  if (inPageRange->mType != eRangeTypeAll) {
    p_Var9 = (_List_node_base *)&inPageRange->mSpecificRanges;
LAB_0019aaf0:
    do {
      if ((EVar3 != eSuccess) ||
         (p_Var9 = (((_List_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                      *)&p_Var9->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
         p_Var9 == (_List_node_base *)&inPageRange->mSpecificRanges)) goto LAB_0019aa69;
      p_Var8 = p_Var9[1]._M_prev;
      if (p_Var9[1]._M_next <= p_Var8) {
        p_Var6 = (_List_node_base *)PDFParser::GetPagesCount(this->mParser);
        if (p_Var8 < p_Var6) {
          EVar3 = eSuccess;
          for (p_Var8 = p_Var9[1]._M_next; (EVar3 == eSuccess && (p_Var8 <= p_Var9[1]._M_prev));
              p_Var8 = (_List_node_base *)((long)&p_Var8->_M_next + 1)) {
            EVar3 = MergePDFPageForPage(this,inPage,(unsigned_long)p_Var8);
            if (EVar3 != eSuccess) {
              pTVar4 = Trace::DefaultTrace();
              Trace::TraceToLog(pTVar4,
                                "PDFDocumentHandler::MergePDFPagesToPage, failed to embed page %ld",
                                p_Var8);
            }
          }
          goto LAB_0019aaf0;
        }
      }
      pTVar4 = Trace::DefaultTrace();
      uVar2 = p_Var9[1]._M_next;
      p_Var8 = p_Var9[1]._M_prev;
      uVar7 = PDFParser::GetPagesCount(this->mParser);
      Trace::TraceToLog(pTVar4,
                        "PDFDocumentHandler::MergePDFPagesToPage, range mismatch. first = %ld, second = %ld, PDF page count = %ld"
                        ,uVar2,p_Var8,uVar7);
      EVar3 = eFailure;
    } while( true );
  }
  inSourcePageIndex = 0;
  while( true ) {
    uVar7 = PDFParser::GetPagesCount(this->mParser);
    if ((EVar3 != eSuccess) || (uVar7 <= inSourcePageIndex)) break;
    EVar3 = MergePDFPageForPage(this,inPage,inSourcePageIndex);
    if (EVar3 != eSuccess) {
      pTVar4 = Trace::DefaultTrace();
      Trace::TraceToLog(pTVar4,"PDFDocumentHandler::MergePDFPagesToPage, failed to embed page %ld",
                        inSourcePageIndex);
    }
    inSourcePageIndex = inSourcePageIndex + 1;
  }
LAB_0019aa69:
  p_Var5 = (this->mExtenders)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  while (((_Rb_tree_header *)p_Var5 != p_Var1 && (EVar3 == eSuccess))) {
    EVar3 = (**(code **)(**(long **)(p_Var5 + 1) + 0x80))
                      (*(long **)(p_Var5 + 1),this->mObjectsContext,this->mDocumentContext,this);
    if (EVar3 != eSuccess) {
      pTVar4 = Trace::DefaultTrace();
      Trace::TraceToLog(pTVar4,
                        "DocumentContext::MergePDFPagesToPage, unexpected failure. extender declared failure before finalizing copy."
                       );
    }
    p_Var5 = (_Base_ptr)std::_Rb_tree_increment(p_Var5);
  }
  StopCopyingContext(this);
  return EVar3;
}

Assistant:

EStatusCode PDFDocumentHandler::MergePDFPagesToPageInContext(PDFPage* inPage,
															const PDFPageRange& inPageRange,
															const ObjectIDTypeList& inCopyAdditionalObjects)
{
	EStatusCode status = PDFHummus::eSuccess;

	do
	{
		IDocumentContextExtenderSet::iterator it = mExtenders.begin();
		for(; it != mExtenders.end() && PDFHummus::eSuccess == status; ++it)
		{
			status = (*it)->OnPDFParsingComplete(mObjectsContext,mDocumentContext,this);
			if(status != PDFHummus::eSuccess)
				TRACE_LOG("DocumentContext::MergePDFPagesToPage, unexpected failure. extender declared failure after parsing page.");
		}

	// copy additional objects prior to pages, so we have them ready at page merging
		if(inCopyAdditionalObjects.size() > 0)
		{
			status = WriteNewObjects(inCopyAdditionalObjects);
			if(status != PDFHummus::eSuccess)
			{
				TRACE_LOG("PDFDocumentHandler::MergePDFPagesToPage, failed copying additional objects");
				break;
			}
		}

		if(PDFPageRange::eRangeTypeAll == inPageRange.mType)
		{
			for(unsigned long i=0; i < mParser->GetPagesCount() && PDFHummus::eSuccess == status; ++i)
			{
				status = MergePDFPageForPage(inPage,i);
				if(status != PDFHummus::eSuccess)
					TRACE_LOG1("PDFDocumentHandler::MergePDFPagesToPage, failed to embed page %ld", i);
			}
		}
		else
		{
			// eRangeTypeSpecific
			ULongAndULongList::const_iterator it = inPageRange.mSpecificRanges.begin();
			for(; it != inPageRange.mSpecificRanges.end() && PDFHummus::eSuccess == status;++it)
			{
				if(it->first <= it->second && it->second < mParser->GetPagesCount())
				{
					for(unsigned long i=it->first; i <= it->second && PDFHummus::eSuccess == status; ++i)
					{
						status = MergePDFPageForPage(inPage,i);
						if(status != PDFHummus::eSuccess)
							TRACE_LOG1("PDFDocumentHandler::MergePDFPagesToPage, failed to embed page %ld", i);
					}
				}
				else
				{
					TRACE_LOG3("PDFDocumentHandler::MergePDFPagesToPage, range mismatch. first = %ld, second = %ld, PDF page count = %ld", 
						it->first,
						it->second,
						mParser->GetPagesCount());
					status = PDFHummus::eFailure;
				}
			}
		}


	}while(false);

	IDocumentContextExtenderSet::iterator it = mExtenders.begin();
	for(; it != mExtenders.end() && PDFHummus::eSuccess == status; ++it)
	{
		status = (*it)->OnPDFCopyingComplete(mObjectsContext,mDocumentContext,this);
		if(status != PDFHummus::eSuccess)
			TRACE_LOG("DocumentContext::MergePDFPagesToPage, unexpected failure. extender declared failure before finalizing copy.");
	}

	StopCopyingContext();

	return status;

}